

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv.c
# Opt level: O2

void conv_direct(double *inp1,int N,double *inp2,int L,double *oup)

{
  int iVar1;
  double *pdVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  double *pdVar8;
  long lVar9;
  double *pdVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  
  iVar1 = N + L + -1;
  uVar6 = 0;
  if (N < L) {
    uVar7 = 0;
    if (0 < N) {
      uVar7 = (ulong)(uint)N;
    }
    lVar9 = 1;
    pdVar2 = inp1;
    for (; uVar6 != uVar7; uVar6 = uVar6 + 1) {
      oup[uVar6] = 0.0;
      dVar12 = 0.0;
      pdVar8 = pdVar2;
      for (lVar11 = 0; lVar9 != lVar11; lVar11 = lVar11 + 1) {
        dVar12 = dVar12 + inp2[lVar11] * *pdVar8;
        oup[uVar6] = dVar12;
        pdVar8 = pdVar8 + -1;
      }
      lVar9 = lVar9 + 1;
      pdVar2 = pdVar2 + 1;
    }
    lVar9 = (long)N;
    pdVar2 = inp1 + lVar9;
    iVar4 = 0;
    iVar5 = 1;
    for (; lVar9 < iVar1; lVar9 = lVar9 + 1) {
      pdVar8 = inp2 + iVar5;
      oup[lVar9] = 0.0;
      pdVar10 = pdVar2 + -(long)iVar5;
      iVar4 = iVar4 + 1;
      dVar12 = (double)iVar4 + (double)N;
      if ((double)L <= (double)iVar4 + (double)N) {
        dVar12 = (double)L;
      }
      dVar13 = 0.0;
      for (iVar3 = iVar5; (double)iVar3 < dVar12; iVar3 = iVar3 + 1) {
        dVar13 = dVar13 + *pdVar8 * *pdVar10;
        oup[lVar9] = dVar13;
        pdVar8 = pdVar8 + 1;
        pdVar10 = pdVar10 + -1;
      }
      iVar5 = iVar5 + 1;
      pdVar2 = pdVar2 + 1;
    }
  }
  else {
    uVar7 = 0;
    if (0 < L) {
      uVar7 = (ulong)(uint)L;
    }
    lVar9 = 1;
    pdVar2 = inp2;
    for (; uVar6 != uVar7; uVar6 = uVar6 + 1) {
      oup[uVar6] = 0.0;
      dVar12 = 0.0;
      pdVar8 = pdVar2;
      for (lVar11 = 0; lVar9 != lVar11; lVar11 = lVar11 + 1) {
        dVar12 = dVar12 + inp1[lVar11] * *pdVar8;
        oup[uVar6] = dVar12;
        pdVar8 = pdVar8 + -1;
      }
      lVar9 = lVar9 + 1;
      pdVar2 = pdVar2 + 1;
    }
    lVar9 = (long)L;
    pdVar2 = inp2 + lVar9;
    iVar4 = 0;
    iVar5 = 1;
    for (; lVar9 < iVar1; lVar9 = lVar9 + 1) {
      pdVar8 = inp1 + iVar5;
      oup[lVar9] = 0.0;
      pdVar10 = pdVar2 + -(long)iVar5;
      iVar4 = iVar4 + 1;
      dVar12 = (double)iVar4 + (double)L;
      if ((double)N <= (double)iVar4 + (double)L) {
        dVar12 = (double)N;
      }
      dVar13 = 0.0;
      for (iVar3 = iVar5; (double)iVar3 < dVar12; iVar3 = iVar3 + 1) {
        dVar13 = dVar13 + *pdVar8 * *pdVar10;
        oup[lVar9] = dVar13;
        pdVar8 = pdVar8 + 1;
        pdVar10 = pdVar10 + -1;
      }
      iVar5 = iVar5 + 1;
      pdVar2 = pdVar2 + 1;
    }
  }
  return;
}

Assistant:

void conv_direct(fft_type *inp1,int N, fft_type *inp2, int L,fft_type *oup) {

	int M,k,m,i;
	fft_type t1,tmin;

	M = N + L -1;
	i = 0;

	if (N >= L) {

		for (k = 0; k < L; k++) {
			oup[k] = 0.0;
			for (m = 0; m <= k;m++) {
				oup[k]+= inp1[m] * inp2[k-m];
			}
		}

		for (k = L; k < M; k++) {
			oup[k] = 0.0;
			i++;
			t1 = (fft_type) L + i;
			tmin = MIN(t1,N);
			for (m = i; m < tmin;m++) {
				oup[k]+= inp1[m] * inp2[k-m];
			}
		}


	} else {
		for (k = 0; k < N; k++) {
			oup[k] = 0.0;
			for (m = 0; m <= k;m++) {
				oup[k]+= inp2[m] * inp1[k-m];
			}
		}

		for (k = N; k < M; k++) {
			oup[k] = 0.0;
			i++;
			t1 = (fft_type) N + i;
			tmin = MIN(t1,L);
			for (m = i; m < tmin;m++) {
				oup[k]+= inp2[m] * inp1[k-m];
			}
		}

	}


}